

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void page_flush_tb_1(uc_struct_conflict15 *uc,int level,void **lp)

{
  long lVar1;
  void **extraout_RDX;
  undefined4 in_register_00000034;
  long lVar2;
  
  lVar1 = *(long *)CONCAT44(in_register_00000034,level);
  if (lVar1 != 0) {
    if ((int)uc == 0) {
      for (lVar2 = 0; lVar2 != 0x6000; lVar2 = lVar2 + 0x18) {
        *(undefined8 *)(lVar1 + lVar2) = 0;
        invalidate_page_bitmap((PageDesc *)(lVar1 + lVar2));
      }
    }
    else {
      for (lVar2 = 0; lVar2 != 0x2000; lVar2 = lVar2 + 8) {
        page_flush_tb_1((uc_struct_conflict15 *)(ulong)((int)uc - 1),(int)lVar1 + (int)lVar2,lp);
        lp = extraout_RDX;
      }
    }
  }
  return;
}

Assistant:

static void page_flush_tb_1(struct uc_struct *uc, int level, void **lp)
{
    int i;

    if (*lp == NULL) {
        return;
    }
    if (level == 0) {
        PageDesc *pd = *lp;

        for (i = 0; i < V_L2_SIZE; ++i) {
            page_lock(&pd[i]);
            pd[i].first_tb = (uintptr_t)NULL;
            invalidate_page_bitmap(pd + i);
            page_unlock(&pd[i]);
        }
    } else {
        void **pp = *lp;

        for (i = 0; i < V_L2_SIZE; ++i) {
            page_flush_tb_1(uc, level - 1, pp + i);
        }
    }
}